

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketAcceptor.cpp
# Opt level: O3

void __thiscall
FIX::SocketAcceptor::onDisconnect(SocketAcceptor *this,SocketServer *param_1,socket_handle s)

{
  _Base_ptr p_Var1;
  _Base_ptr p_Var2;
  _Rb_tree_header *p_Var3;
  pair<std::_Rb_tree_iterator<std::pair<const_int,_FIX::SocketConnection_*>_>,_std::_Rb_tree_iterator<std::pair<const_int,_FIX::SocketConnection_*>_>_>
  pVar4;
  key_type local_14;
  
  p_Var2 = (this->m_connections)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (p_Var2 != (_Base_ptr)0x0) {
    p_Var3 = &(this->m_connections)._M_t._M_impl.super__Rb_tree_header;
    p_Var1 = &p_Var3->_M_header;
    do {
      if (s <= (int)p_Var2[1]._M_color) {
        p_Var1 = p_Var2;
      }
      p_Var2 = (&p_Var2->_M_left)[(int)p_Var2[1]._M_color < s];
    } while (p_Var2 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var1 != p_Var3) && ((int)p_Var1[1]._M_color <= s)) {
      p_Var2 = p_Var1[1]._M_parent;
      if ((Session *)p_Var2[0x105]._M_right != (Session *)0x0) {
        Session::disconnect((Session *)p_Var2[0x105]._M_right);
      }
      (**(code **)(*(long *)p_Var2 + 8))(p_Var2);
      pVar4 = std::
              _Rb_tree<int,_std::pair<const_int,_FIX::SocketConnection_*>,_std::_Select1st<std::pair<const_int,_FIX::SocketConnection_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_FIX::SocketConnection_*>_>_>
              ::equal_range(&(this->m_connections)._M_t,&local_14);
      std::
      _Rb_tree<int,_std::pair<const_int,_FIX::SocketConnection_*>,_std::_Select1st<std::pair<const_int,_FIX::SocketConnection_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_FIX::SocketConnection_*>_>_>
      ::_M_erase_aux(&(this->m_connections)._M_t,(_Base_ptr)pVar4.first._M_node,
                     (_Base_ptr)pVar4.second._M_node);
    }
  }
  return;
}

Assistant:

void SocketAcceptor::onDisconnect( SocketServer&, socket_handle s )
{
  SocketConnections::iterator i = m_connections.find( s );
  if ( i == m_connections.end() ) return ;
  SocketConnection* pSocketConnection = i->second;

  Session* pSession = pSocketConnection->getSession();
  if ( pSession ) pSession->disconnect();

  delete pSocketConnection;
  m_connections.erase( s );
}